

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Symbol * __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::makeSymbol<tcu::Vector<int,2>>
          (Symbol *__return_storage_ptr__,PrecisionCase *this,
          Variable<tcu::Vector<int,_2>_> *variable)

{
  Precision prec;
  VarType VStack_48;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&variable->m_name);
  glu::varTypeOf<tcu::Vector<int,2>>(&VStack_48,(glu *)(ulong)(this->m_ctx).precision,prec);
  ShaderExecUtil::Symbol::Symbol(__return_storage_ptr__,&local_30,&VStack_48);
  glu::VarType::~VarType(&VStack_48);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Symbol				makeSymbol		(const Variable<T>& variable)
	{
		return Symbol(variable.getName(), getVarTypeOf<T>(m_ctx.precision));
	}